

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_ArgOut_Env<Js::OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  RegSlot RVar1;
  FrameDisplay *local_20;
  Var argEnv;
  OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  RVar1 = FunctionBody::GetLocalFrameDisplayRegister(*(FunctionBody **)(this + 0x88));
  if (RVar1 == 0xffffffff) {
    local_20 = (FrameDisplay *)LdEnv(this);
  }
  else {
    local_20 = GetLocalFrameDisplay(this);
  }
  SetOut(this,playout->Arg,local_20);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ArgOut_Env(const unaligned T * playout)
    {
        Var argEnv;
        if (this->m_functionBody->GetLocalFrameDisplayRegister() != Constants::NoRegister)
        {
            argEnv = this->GetLocalFrameDisplay();
        }
        else
        {
            argEnv = this->LdEnv();
        }
        SetOut(playout->Arg, argEnv);
    }